

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateMachinePattern.cpp
# Opt level: O1

void __thiscall State1::executeStateTask(State1 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  element_type *peVar3;
  pointer psVar4;
  int iVar5;
  size_t sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  peVar2 = (this->super_State).spData.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"State 1 was here","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)peVar2,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  peVar3 = (this->super_State).spStatus.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"STM: Executing state 1","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((peVar3->spExecMessage).
              super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  do {
    iVar5 = rand();
    sVar6 = (size_t)(iVar5 % 4 + 1);
    peVar2 = (this->super_State).spData.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  } while (peVar2->nPreviousRandomNumber == sVar6);
  peVar2->nPreviousRandomNumber = sVar6;
  psVar4 = (this->super_State).spPossibleNextStates.
           super__Vector_base<std::shared_ptr<State>,_std::allocator<std::shared_ptr<State>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->super_State).spNextState.super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       psVar4[sVar6 - 1].super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_State).spNextState.super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &psVar4[sVar6 - 1].super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void State1::executeStateTask()
{
    spData->vGuestBook.push_back( "State 1 was here" );
    spStatus->setStatusMessage("STM: Executing state 1");
    
    size_t nRsandNum = ( rand() % 4 ) + 1;
    
    while(spData->nPreviousRandomNumber == nRsandNum )
    {
        nRsandNum = ( rand() % 4 ) + 1;
    }
     
    spData->nPreviousRandomNumber = nRsandNum;

    spNextState = spPossibleNextStates[nRsandNum-1];
}